

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.cpp
# Opt level: O2

uint __thiscall glsl_type::cl_alignment(glsl_type *this)

{
  glsl_type *pgVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint i;
  ulong uVar6;
  
  for (; (this->vector_elements != '\x01' || (0xd < (*(uint *)&this->field_0x4 & 0xfe)));
      this = without_array(this)) {
    bVar2 = is_vector(this);
    if (bVar2) break;
    uVar4 = *(uint *)&this->field_0x4;
    if ((char)uVar4 != '\x11') {
      if (((uVar4 & 0xff) == 0xf) && ((uVar4 >> 0x19 & 1) == 0)) {
        uVar4 = 1;
        lVar5 = 0;
        for (uVar6 = 0; uVar6 < this->length; uVar6 = uVar6 + 1) {
          pgVar1 = (this->fields).array;
          uVar3 = cl_alignment(*(glsl_type **)((long)&pgVar1->gl_type + lVar5));
          if (uVar4 <= uVar3) {
            uVar4 = cl_alignment(*(glsl_type **)((long)&pgVar1->gl_type + lVar5));
          }
          lVar5 = lVar5 + 0x30;
        }
      }
      else {
        uVar4 = 1;
      }
      return uVar4;
    }
  }
  uVar4 = cl_size(this);
  return uVar4;
}

Assistant:

unsigned
glsl_type::cl_alignment() const
{
   /* vectors unlike arrays are aligned to their size */
   if (this->is_scalar() || this->is_vector())
      return this->cl_size();
   else if (this->is_array())
      return this->without_array()->cl_alignment();
   else if (this->is_struct()) {
      /* Packed Structs are 0x1 aligned despite their size. */
      if (this->packed)
         return 1;

      unsigned res = 1;
      for (unsigned i = 0; i < this->length; ++i) {
         struct glsl_struct_field &field = this->fields.structure[i];
         res = MAX2(res, field.type->cl_alignment());
      }
      return res;
   }
   return 1;
}